

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void Luv24fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  
  puVar4 = (uint *)sp->tbuf;
  for (; 0 < n; n = n + -1) {
    uVar1 = *(ushort *)op;
    if ((short)uVar1 < 1) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0x3ff;
      if (uVar1 < 0x1cf2) {
        if (sp->encode_meth == 0) {
          iVar2 = (short)uVar1 + -0xcf2 >> 2;
        }
        else {
          iVar2 = tiff_itrunc(((double)(int)(short)uVar1 + -3314.0) * 0.25,sp->encode_meth);
        }
      }
    }
    uVar3 = uv_encode(((double)(int)(short)*(ushort *)((long)op + 2) + 0.5) * 3.0517578125e-05,
                      ((double)(int)(short)*(ushort *)((long)op + 4) + 0.5) * 3.0517578125e-05,
                      sp->encode_meth);
    if ((int)uVar3 < 0) {
      uVar3 = uv_encode(0.210526316,0.473684211,0);
    }
    *puVar4 = iVar2 << 0xe | uVar3;
    puVar4 = puVar4 + 1;
    op = (uint8_t *)((long)op + 6);
  }
  return;
}

Assistant:

static void Luv24fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        int Le, Ce;

        if (luv3[0] <= 0)
            Le = 0;
        else if (luv3[0] >= (1 << 12) + 3314)
            Le = (1 << 10) - 1;
        else if (sp->encode_meth == SGILOGENCODE_NODITHER)
            Le = (luv3[0] - 3314) >> 2;
        else
            Le = tiff_itrunc(.25 * (luv3[0] - 3314.), sp->encode_meth);

        Ce = uv_encode((luv3[1] + .5) / (1 << 15), (luv3[2] + .5) / (1 << 15),
                       sp->encode_meth);
        if (Ce < 0) /* never happens */
            Ce = uv_encode(U_NEU, V_NEU, SGILOGENCODE_NODITHER);
        *luv++ = (uint32_t)Le << 14 | Ce;
        luv3 += 3;
    }
}